

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O3

optional<tinyusdz::Path> * __thiscall
tinyusdz::crate::CrateReader::GetPath
          (optional<tinyusdz::Path> *__return_storage_ptr__,CrateReader *this,Index index)

{
  pointer pPVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = (ulong)index.value;
  pPVar1 = (this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1 >> 4) * 0x4ec4ec4ec4ec4ec5
  ;
  if (uVar3 < uVar2 || uVar3 - uVar2 == 0) {
    __return_storage_ptr__->has_value_ = false;
    memset(&__return_storage_ptr__->contained,0,0xd0);
  }
  else {
    __return_storage_ptr__->has_value_ = true;
    Path::Path((Path *)&__return_storage_ptr__->contained,pPVar1 + uVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<Path> CrateReader::GetPath(crate::Index index) const {

  if (index.value < _paths.size()) {
    // ok
  } else {
    return nonstd::nullopt;
  }

  return _paths[index.value];
}